

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_size(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  
  if ((((data->req).p.file)->fd == 1) && ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"SIZE %s");
    if (CVar1 == CURLE_OK) {
      _ftp_state(data,'\x17');
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  CVar1 = ftp_state_rest(data,conn);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_size(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer == PPTRANSFER_INFO) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* we know ftpc->file is a valid pointer to a filename */
    result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
    if(!result)
      ftp_state(data, FTP_SIZE);
  }
  else
    result = ftp_state_rest(data, conn);

  return result;
}